

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O2

string * __thiscall
LinearSystem::SwapMatrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,SwapMatrix *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ostream *poVar4;
  ostringstream out;
  allocator<char> local_1a0 [376];
  
  bVar3 = IsEmpty(this);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",local_1a0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar4 = std::operator<<((ostream *)local_1a0,"\\begin{bmatrix}");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar3 = this->first_row_ != this->second_row_;
    if (bVar3) {
      poVar4 = std::operator<<((ostream *)local_1a0,"row: \\\\");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,this->first_row_);
      poVar4 = std::operator<<(poVar4," \\leftrightarrows ");
      std::ostream::operator<<((ostream *)poVar4,this->second_row_);
    }
    iVar1 = this->first_main_column_;
    iVar2 = this->second_main_column_;
    if (iVar1 != iVar2) {
      if (bVar3) {
        poVar4 = std::operator<<((ostream *)local_1a0," \\\\");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      poVar4 = std::operator<<((ostream *)local_1a0,"col: \\\\");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,this->first_main_column_);
      poVar4 = std::operator<<(poVar4," \\leftrightarrows ");
      bVar3 = true;
      std::ostream::operator<<((ostream *)poVar4,this->second_main_column_);
    }
    if (this->first_extension_column_ != this->second_extension_column_) {
      if (bVar3) {
        poVar4 = std::operator<<((ostream *)local_1a0," \\\\");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      if (iVar1 == iVar2) {
        poVar4 = std::operator<<((ostream *)local_1a0,"col: \\\\");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      poVar4 = (ostream *)
               std::ostream::operator<<((ostream *)local_1a0,this->first_extension_column_);
      poVar4 = std::operator<<(poVar4," \\leftrightarrows ");
      std::ostream::operator<<((ostream *)poVar4,this->second_extension_column_);
    }
    std::endl<char,std::char_traits<char>>((ostream *)local_1a0);
    std::operator<<((ostream *)local_1a0,"\\end{bmatrix}");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LinearSystem::SwapMatrix::ToLaTex() const {
  if (IsEmpty()) {
    return "";
  }
  std::ostringstream out;
  bool started = false;
  out << "\\begin{bmatrix}" << std::endl;
  if (first_row_ != second_row_) {
    started = true;
    out << "row: \\\\" << std::endl;
    out << first_row_  << " \\leftrightarrows " << second_row_;
  }
  bool is_column_writed = false;
  if (first_main_column_ != second_main_column_) {
    if (started) {
      out << " \\\\" << std::endl;
    }
    out << "col: \\\\" << std::endl;
    is_column_writed = true;
    started = true;
    out << first_main_column_ << " \\leftrightarrows " << second_main_column_;
  }
  if (first_extension_column_ != second_extension_column_) {
    if (started) {
      out << " \\\\" << std::endl;
    }
    if (!is_column_writed) {
        out << "col: \\\\" << std::endl;
    }
    out << first_extension_column_ << " \\leftrightarrows " << second_extension_column_;
  }
  out << std::endl;
  out << "\\end{bmatrix}";

  return out.str();
}